

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O1

ostream * operator<<(ostream *out,bdProxyTuple *t)

{
  std::__ostream_insert<char,std::char_traits<char>>(out,"[---",4);
  bdStdPrintNodeId(out,&t->srcId);
  std::__ostream_insert<char,std::char_traits<char>>(out,"---",3);
  bdStdPrintNodeId(out,&t->proxyId);
  std::__ostream_insert<char,std::char_traits<char>>(out,"---",3);
  bdStdPrintNodeId(out,&t->destId);
  std::__ostream_insert<char,std::char_traits<char>>(out,"---]",4);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const bdProxyTuple &t) {
	out << "[---";
	bdStdPrintNodeId(out, &(t.srcId));
	out << "---";
	bdStdPrintNodeId(out, &(t.proxyId));
	out << "---";
	bdStdPrintNodeId(out, &(t.destId));
	out << "---]";

	return out;
}